

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

find_result __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::find_child(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *this,byte key_byte)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
  pVar5;
  find_result fVar6;
  undefined8 local_138;
  longlong lStack_130;
  reference local_f0;
  byte local_e1;
  uint local_e0;
  uint uStack_dc;
  uint8_t i;
  uint bit_field;
  uint mask;
  __m128i matching_key_positions;
  __m128i keys_in_sse_reg;
  __m128i replicated_search_key;
  byte key_byte_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *local_88;
  ulong local_78;
  
  auVar1 = vpinsrb_avx(ZEXT116(key_byte),(uint)key_byte,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)key_byte,0xf);
  uVar4 = in_fake_critical_section<unsigned_int>::load
                    ((in_fake_critical_section<unsigned_int> *)&(this->keys).byte_array);
  local_78 = CONCAT44(0,uVar4);
  matching_key_positions[1] = local_78;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_78;
  auVar1 = vpcmpeqb_avx(auVar1,auVar2);
  local_138 = auVar1._0_8_;
  lStack_130 = auVar1._8_8_;
  _bit_field = local_138;
  matching_key_positions[0] = lStack_130;
  bVar3 = in_fake_critical_section<unsigned_char>::load
                    ((in_fake_critical_section<unsigned_char> *)&this->field_0x8);
  uStack_dc = (1 << (bVar3 & 0x1f)) - 1;
  auVar1._8_8_ = matching_key_positions[0];
  auVar1._0_8_ = _bit_field;
  local_e0 = (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 7) & 1) << 8 |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0xf) & 1) << 9 |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0x17) & 1) << 10 |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0x1f) & 1) << 0xb |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0x27) & 1) << 0xc |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0x2f) & 1) << 0xd |
                      (ushort)((byte)((ulong)matching_key_positions[0] >> 0x37) & 1) << 0xe |
                     (ushort)(byte)((ulong)matching_key_positions[0] >> 0x3f) << 0xf) & uStack_dc;
  if (local_e0 == 0) {
    this_local._0_1_ = 0xff;
    local_88 = (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                *)0x0;
  }
  else {
    local_e1 = ctz<unsigned_int>(local_e0);
    local_f0 = std::
               array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
               ::operator[](&this->children,(ulong)local_e1);
    pVar5 = std::
            make_pair<unsigned_char_const&,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                      (&local_e1,&local_f0);
    local_88 = pVar5.second;
    this_local._0_1_ = pVar5.first;
  }
  fVar6._1_7_ = (undefined7)((ulong)local_88 >> 8);
  fVar6.first = (uchar)this_local;
  fVar6.second = local_88;
  return fVar6;
}

Assistant:

[[nodiscard, gnu::pure]] find_result find_child(std::byte key_byte) noexcept {
#ifdef UNODB_DETAIL_X86_64
    const auto replicated_search_key =
        _mm_set1_epi8(static_cast<char>(key_byte));
    const auto keys_in_sse_reg =
        _mm_cvtsi32_si128(static_cast<std::int32_t>(keys.integer.load()));
    const auto matching_key_positions =
        _mm_cmpeq_epi8(replicated_search_key, keys_in_sse_reg);
    const auto mask = (1U << this->children_count.load()) - 1;
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(matching_key_positions)) & mask;
    if (bit_field != 0) {
      const auto i = detail::ctz(bit_field);
      return std::make_pair(
          i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    }
    return parent_class::child_not_found;
#elif defined(__aarch64__)
    const auto replicated_search_key =
        vdupq_n_u8(static_cast<std::uint8_t>(key_byte));
    const auto keys_in_neon_reg = vreinterpretq_u8_u32(
        // NOLINTNEXTLINE(misc-const-correctness)
        vsetq_lane_u32(keys.integer.load(), vdupq_n_u32(0), 0));
    const auto mask = (1ULL << (this->children_count.load() << 3U)) - 1;
    const auto matching_key_positions =
        vceqq_u8(replicated_search_key, keys_in_neon_reg);
    const auto u64_pos_in_vec =
        vget_low_u64(vreinterpretq_u64_u8(matching_key_positions));
    // NOLINTNEXTLINE(misc-const-correctness)
    const auto pos_in_scalar = vget_lane_u64(u64_pos_in_vec, 0);
    const auto masked_pos = pos_in_scalar & mask;

    if (masked_pos == 0) return parent_class::child_not_found;

    const auto i = static_cast<unsigned>(detail::ctz(masked_pos) >> 3U);
    return std::make_pair(
        i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
#else   // #ifdef UNODB_DETAIL_X86_64
    // Bit twiddling:
    // contains_byte:     __builtin_ffs:   for key index:
    //    0x80000000               0x20                3
    //      0x800000               0x18                2
    //      0x808000               0x10                1
    //          0x80                0x8                0
    //           0x0                0x0        not found
    const auto result =
        static_cast<typename decltype(keys.byte_array)::size_type>(
            // __builtin_ffs takes signed argument:
            // NOLINTNEXTLINE(hicpp-signed-bitwise)
            __builtin_ffs(static_cast<std::int32_t>(
                contains_byte(keys.integer, key_byte))) >>
            3);

    // The second condition could be replaced with masking, but this seems to
    // result in a benchmark regression
    if ((result == 0) || (result > this->children_count.load()))
      return parent_class::child_not_found;

    return std::make_pair(result - 1,
                          static_cast<critical_section_policy<node_ptr> *>(
                              &children[result - 1]));
#endif  // #ifdef UNODB_DETAIL_X86_64
  }